

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock_test.cpp
# Opt level: O1

void * reader_thread_func(void *data)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  iVar1 = p_atomic_int_get(&writers_counter);
  while (iVar1 == 0) {
    p_uthread_sleep(10);
    iVar1 = p_atomic_int_get(&writers_counter);
  }
  iVar1 = 0;
  if (is_threads_working == 1) {
    iVar1 = 0;
    do {
      p_uthread_sleep(10);
      iVar2 = p_rwlock_reader_trylock(test_rwlock);
      if ((iVar2 == 0) && (iVar2 = p_rwlock_reader_lock(test_rwlock), iVar2 == 0)) {
        p_uthread_exit(0xffffffff);
      }
      auVar3[0] = -(string_buf[7] == ' ');
      auVar3[1] = -(string_buf[8] == 'a');
      auVar3[2] = -(string_buf[9] == ' ');
      auVar3[3] = -(string_buf[10] == 't');
      auVar3[4] = -(string_buf[0xb] == 'e');
      auVar3[5] = -(string_buf[0xc] == 's');
      auVar3[6] = -(string_buf[0xd] == 't');
      auVar3[7] = -(string_buf[0xe] == ' ');
      auVar3[8] = -(string_buf[0xf] == 's');
      auVar3[9] = -(string_buf[0x10] == 't');
      auVar3[10] = -(string_buf[0x11] == 'r');
      auVar3[0xb] = -(string_buf[0x12] == 'i');
      auVar3[0xc] = -(string_buf[0x13] == 'n');
      auVar3[0xd] = -(string_buf[0x14] == 'g');
      auVar3[0xe] = -(string_buf[0x15] == '.');
      auVar3[0xf] = -(string_buf[0x16] == '\0');
      auVar4[0] = -(string_buf[0] == 'T');
      auVar4[1] = -(string_buf[1] == 'h');
      auVar4[2] = -(string_buf[2] == 'i');
      auVar4[3] = -(string_buf[3] == 's');
      auVar4[4] = -(string_buf[4] == ' ');
      auVar4[5] = -(string_buf[5] == 'i');
      auVar4[6] = -(string_buf[6] == 's');
      auVar4[7] = -(string_buf[7] == ' ');
      auVar4[8] = -(string_buf[8] == 'a');
      auVar4[9] = -(string_buf[9] == ' ');
      auVar4[10] = -(string_buf[10] == 't');
      auVar4[0xb] = -(string_buf[0xb] == 'e');
      auVar4[0xc] = -(string_buf[0xc] == 's');
      auVar4[0xd] = -(string_buf[0xd] == 't');
      auVar4[0xe] = -(string_buf[0xe] == ' ');
      auVar4[0xf] = -(string_buf[0xf] == 's');
      auVar4 = auVar4 & auVar3;
      if (((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) &&
         (iVar2 = bcmp(string_buf,"Ouh, yet another string to check!",0x22), iVar2 != 0)) {
        p_rwlock_reader_unlock(test_rwlock);
        p_uthread_exit(0xffffffff);
      }
      iVar2 = p_rwlock_reader_unlock(test_rwlock);
      if (iVar2 == 0) {
        p_uthread_exit(0xffffffff);
      }
      iVar1 = iVar1 + 1;
    } while (is_threads_working == 1);
  }
  p_uthread_exit(iVar1);
  return (void *)0x0;
}

Assistant:

static void * reader_thread_func (void *data)
{
	P_UNUSED (data);

	pint counter = 0;

	while (p_atomic_int_get (&writers_counter) == 0)
		p_uthread_sleep (10);

	while (is_threads_working == TRUE) {
		p_uthread_sleep (10);

		if (p_rwlock_reader_trylock (test_rwlock) == FALSE) {
			if (p_rwlock_reader_lock (test_rwlock) == FALSE)
				p_uthread_exit (-1);
		}

		if (strcmp (string_buf, PRWLOCK_TEST_STRING_1) != 0 &&
		    strcmp (string_buf, PRWLOCK_TEST_STRING_2) != 0) {
			p_rwlock_reader_unlock (test_rwlock);
			p_uthread_exit (-1);
		}

		if (p_rwlock_reader_unlock (test_rwlock) == FALSE)
			p_uthread_exit (-1);

		++counter;
	}

	p_uthread_exit (counter);

	return NULL;
}